

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

bool __thiscall
vkt::shaderexecutor::anon_unknown_0::FmaCaseInstance::compare
          (FmaCaseInstance *this,void **inputs,void **outputs)

{
  bool bVar1;
  DataType dataType;
  int iVar2;
  const_reference pvVar3;
  ostream *poVar4;
  Interval local_78;
  undefined1 local_60 [8];
  Interval ref;
  float res;
  float c;
  float b;
  float a;
  int compNdx;
  int scalarSize;
  Precision precision;
  DataType type;
  void **outputs_local;
  void **inputs_local;
  FmaCaseInstance *this_local;
  
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  dataType = glu::VarType::getBasicType(&pvVar3->varType);
  pvVar3 = std::vector<vkt::shaderexecutor::Symbol,_std::allocator<vkt::shaderexecutor::Symbol>_>::
           operator[](&(this->super_CommonFunctionTestInstance).m_spec.inputs,0);
  glu::VarType::getPrecision(&pvVar3->varType);
  iVar2 = glu::getDataTypeScalarSize(dataType);
  b = 0.0;
  while( true ) {
    if (iVar2 <= (int)b) {
      return true;
    }
    ref.m_hi._4_4_ = *(uint *)((long)inputs[2] + (long)(int)b * 4);
    ref.m_hi._0_4_ = *(float *)((long)*outputs + (long)(int)b * 4);
    fma((double)(ulong)*(uint *)((long)*inputs + (long)(int)b * 4),
        (double)(ulong)*(uint *)((long)inputs[1] + (long)(int)b * 4),(double)(ulong)ref.m_hi._4_4_);
    tcu::Interval::Interval(&local_78,(double)ref.m_hi._0_4_);
    bVar1 = tcu::Interval::contains((Interval *)local_60,&local_78);
    if (((bVar1 ^ 0xffU) & 1) != 0) break;
    b = (float)((int)b + 1);
  }
  poVar4 = std::operator<<((ostream *)&(this->super_CommonFunctionTestInstance).m_failMsg,
                           "Expected [");
  poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)b);
  poVar4 = std::operator<<(poVar4,"] = ");
  tcu::operator<<(poVar4,(Interval *)local_60);
  return false;
}

Assistant:

bool compare (const void* const* inputs, const void* const* outputs)
	{
		const glu::DataType		type			= m_spec.inputs[0].varType.getBasicType();
		const glu::Precision	precision		= m_spec.inputs[0].varType.getPrecision();
		const int				scalarSize		= glu::getDataTypeScalarSize(type);

		for (int compNdx = 0; compNdx < scalarSize; compNdx++)
		{
			const float			a			= ((const float*)inputs[0])[compNdx];
			const float			b			= ((const float*)inputs[1])[compNdx];
			const float			c			= ((const float*)inputs[2])[compNdx];
			const float			res			= ((const float*)outputs[0])[compNdx];
			const tcu::Interval	ref			= fma(precision, a, b, c);

			if (!ref.contains(res))
			{
				m_failMsg << "Expected [" << compNdx << "] = " << ref;
				return false;
			}
		}

		return true;
	}